

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

string * jsonnet::internal::jsonnet_fmt_abi_cxx11_(AST *ast,Fodder *final_fodder,FmtOpts *opts)

{
  bool bVar1;
  reference pvVar2;
  FmtOpts *in_RCX;
  Allocator *in_RDI;
  Unparser unparser;
  stringstream ss;
  bool in_stack_000001c7;
  AST *in_stack_000001c8;
  Unparser *in_stack_000001d0;
  Allocator alloc;
  Allocator *this;
  Allocator *in_stack_fffffffffffffba8;
  StripAllButComments *in_stack_fffffffffffffbb0;
  AST *in_stack_fffffffffffffbb8;
  AST *in_stack_fffffffffffffbc0;
  stringstream local_438 [16];
  ostream local_428 [16];
  AST **in_stack_fffffffffffffbe8;
  Allocator *in_stack_fffffffffffffbf0;
  FixIndentation local_2b0 [18];
  SortImports local_70;
  Allocator local_68;
  FmtOpts *local_20;
  
  this = in_RDI;
  local_20 = in_RCX;
  Allocator::Allocator(in_RDI);
  if ((local_20->sortImports & 1U) != 0) {
    SortImports::SortImports(&local_70,&local_68);
    SortImports::file((SortImports *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  }
  remove_initial_newlines(in_stack_fffffffffffffbc0);
  if (local_20->maxBlankLines != 0) {
    EnforceMaximumBlankLines::EnforceMaximumBlankLines
              ((EnforceMaximumBlankLines *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (FmtOpts *)this);
    CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                       (Fodder *)this);
  }
  FixNewlines::FixNewlines
            ((FixNewlines *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(FmtOpts *)this);
  CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                     (Fodder *)this);
  FixTrailingCommas::FixTrailingCommas
            ((FixTrailingCommas *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (FmtOpts *)this);
  CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                     (Fodder *)this);
  FixTrailingCommas::~FixTrailingCommas((FixTrailingCommas *)0x233edd);
  FixParens::FixParens
            ((FixParens *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(FmtOpts *)this);
  CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                     (Fodder *)this);
  FixPlusObject::FixPlusObject
            ((FixPlusObject *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(FmtOpts *)this);
  CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                     (Fodder *)this);
  NoRedundantSliceColon::NoRedundantSliceColon
            ((NoRedundantSliceColon *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             (FmtOpts *)this);
  CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                     (Fodder *)this);
  if ((local_20->stripComments & 1U) == 0) {
    if ((local_20->stripAllButComments & 1U) == 0) {
      if ((local_20->stripEverything & 1U) != 0) {
        StripEverything::StripEverything
                  ((StripEverything *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                   (FmtOpts *)this);
        CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,
                           (AST **)in_stack_fffffffffffffba8,(Fodder *)this);
      }
    }
    else {
      StripAllButComments::StripAllButComments
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(FmtOpts *)this);
      StripAllButComments::file
                (in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,(Fodder *)this);
      StripAllButComments::~StripAllButComments((StripAllButComments *)0x234067);
    }
  }
  else {
    StripComments::StripComments
              ((StripComments *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(FmtOpts *)this)
    ;
    CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                       (Fodder *)this);
  }
  if ((local_20->prettyFieldNames & 1U) != 0) {
    PrettyFieldNames::PrettyFieldNames
              ((PrettyFieldNames *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (FmtOpts *)this);
    CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                       (Fodder *)this);
  }
  if (local_20->stringStyle != 'l') {
    EnforceStringStyle::EnforceStringStyle
              ((EnforceStringStyle *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (FmtOpts *)this);
    CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                       (Fodder *)this);
  }
  if (local_20->commentStyle != 'l') {
    EnforceCommentStyle::EnforceCommentStyle
              ((EnforceCommentStyle *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
               (FmtOpts *)this);
    CompilerPass::file((CompilerPass *)in_stack_fffffffffffffbb0,(AST **)in_stack_fffffffffffffba8,
                       (Fodder *)this);
  }
  if (local_20->indent != 0) {
    FixIndentation::FixIndentation(local_2b0,local_20);
    FixIndentation::file
              ((FixIndentation *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (Fodder *)in_stack_fffffffffffffbb0);
  }
  remove_extra_trailing_newlines((Fodder *)0x234223);
  std::__cxx11::stringstream::stringstream(local_438);
  Unparser::Unparser((Unparser *)&stack0xfffffffffffffba8,local_428,local_20);
  Unparser::unparse(in_stack_000001d0,in_stack_000001c8,in_stack_000001c7);
  Unparser::fill_final((Unparser *)this,(Fodder *)in_RDI,false,false);
  bVar1 = std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::empty((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)in_stack_fffffffffffffbb0);
  if ((bVar1) ||
     (pvVar2 = std::
               vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ::back((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)this), pvVar2->kind == INTERSTITIAL)) {
    std::operator<<(local_428,"\n");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_438);
  Allocator::~Allocator(in_stack_fffffffffffffbf0);
  return (string *)this;
}

Assistant:

std::string jsonnet_fmt(AST *ast, Fodder &final_fodder, const FmtOpts &opts)
{
    Allocator alloc;

    // Passes to enforce style on the AST.
    if (opts.sortImports)
        SortImports(alloc).file(ast);
    remove_initial_newlines(ast);
    if (opts.maxBlankLines > 0)
        EnforceMaximumBlankLines(alloc, opts).file(ast, final_fodder);
    FixNewlines(alloc, opts).file(ast, final_fodder);
    FixTrailingCommas(alloc, opts).file(ast, final_fodder);
    FixParens(alloc, opts).file(ast, final_fodder);
    FixPlusObject(alloc, opts).file(ast, final_fodder);
    NoRedundantSliceColon(alloc, opts).file(ast, final_fodder);
    if (opts.stripComments)
        StripComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripAllButComments)
        StripAllButComments(alloc, opts).file(ast, final_fodder);
    else if (opts.stripEverything)
        StripEverything(alloc, opts).file(ast, final_fodder);
    if (opts.prettyFieldNames)
        PrettyFieldNames(alloc, opts).file(ast, final_fodder);
    if (opts.stringStyle != 'l')
        EnforceStringStyle(alloc, opts).file(ast, final_fodder);
    if (opts.commentStyle != 'l')
        EnforceCommentStyle(alloc, opts).file(ast, final_fodder);
    if (opts.indent > 0)
        FixIndentation(opts).file(ast, final_fodder);
    remove_extra_trailing_newlines(final_fodder);

    std::stringstream ss;
    Unparser unparser(ss, opts);
    unparser.unparse(ast, false);
    unparser.fill_final(final_fodder, true, false);
    if (final_fodder.empty() || final_fodder.back().kind == FodderElement::INTERSTITIAL) {
        ss << "\n";
    }
    return ss.str();
}